

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O1

void Am_Choice_Do_proc(Am_Object *inter)

{
  bool set_selected;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object new_object;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  local_28.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&local_28,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xdd,0);
  set_selected = Am_Value::operator_cast_to_bool(pAVar2);
  if (set_selected) {
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      Am_Object::Set(&local_28,0x173,false,1);
    }
  }
  Am_Object::Am_Object(&local_18,inter);
  Am_Choice_Set_Value(&local_18,set_selected);
  Am_Object::~Am_Object(&local_18);
  value = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Object::Set(inter,0x16d,value,0);
  Am_Object::Am_Object(&local_20,inter);
  Am_Copy_Values_To_Command(&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_Do, (Am_Object inter))
{
  Am_Object new_object;
  new_object = inter.Get(Am_INTERIM_VALUE);
  bool set_selected = inter.Get(Am_SET_SELECTED);
  if (set_selected) {
    if (new_object.Valid()) {
      Am_REPORT_SET_SEL_VALUE(false, inter, new_object, false);
      new_object.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  }
  Am_Choice_Set_Value(inter, set_selected);
  inter.Set(Am_OBJECT_MODIFIED, new_object);
  Am_Copy_Values_To_Command(inter);
}